

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O2

void xLearn::MAEMetric::mae_accum_thread
               (vector<float,_std::allocator<float>_> *Y,vector<float,_std::allocator<float>_> *pred
               ,real_t *error,size_t start_idx,size_t end_idx)

{
  float fVar1;
  ostream *poVar2;
  size_t i;
  float fVar3;
  undefined1 auVar4 [16];
  allocator local_56;
  allocator local_55;
  Logger local_54;
  string local_50;
  string local_30;
  
  if (start_idx <= end_idx) {
    *error = 0.0;
    fVar3 = 0.0;
    while (end_idx != start_idx) {
      fVar1 = (Y->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
              ._M_start[start_idx] -
              (pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_start[start_idx];
      start_idx = start_idx + 1;
      auVar4._0_4_ = -fVar1;
      auVar4._4_4_ = 0x80000000;
      auVar4._8_4_ = 0x80000000;
      auVar4._12_4_ = 0x80000000;
      auVar4 = vmaxss_avx(ZEXT416((uint)fVar1),auVar4);
      fVar3 = fVar3 + auVar4._0_4_;
      *error = fVar3;
    }
    return;
  }
  local_54.severity_ = ERR;
  std::__cxx11::string::string
            ((string *)&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric.h"
             ,&local_55);
  std::__cxx11::string::string((string *)&local_50,"mae_accum_thread",&local_56);
  poVar2 = Logger::Start(ERR,&local_30,0x26b,&local_50);
  poVar2 = std::operator<<(poVar2,"CHECK_GE failed ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric.h"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x26b);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"end_idx");
  poVar2 = std::operator<<(poVar2," = ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"start_idx");
  poVar2 = std::operator<<(poVar2," = ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  Logger::~Logger(&local_54);
  abort();
}

Assistant:

static void mae_accum_thread(const std::vector<real_t>* Y,
                               const std::vector<real_t>* pred,
                               real_t* error,
                               size_t start_idx,
                               size_t end_idx) {
    CHECK_GE(end_idx, start_idx);
    *error = 0;
    for (size_t i = start_idx; i < end_idx; ++i) {
      (*error) += abs((*Y)[i] - (*pred)[i]);
    }
  }